

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

bool __thiscall pg::QPTSolver::lift(QPTSolver *this,int v,int target)

{
  int iVar1;
  int iVar2;
  int maxopp;
  int *piVar3;
  int *piVar4;
  bitset *this_00;
  QPTSolver *pQVar5;
  uint *puVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  unsigned_long uVar11;
  int iVar12;
  int *piVar13;
  char *pcVar14;
  size_t pos;
  _label_vertex _Var15;
  int aiStack_460 [6];
  ostream *local_448;
  ostream *local_440;
  ostream *local_438;
  ostream *local_430;
  ostream *local_428;
  ostream *local_420;
  ostream *local_418;
  ostream *local_410;
  ostream *local_408;
  ostream *local_400;
  ostream *local_3f8;
  ostream *local_3f0;
  ostream *local_3e8;
  ostream *local_3e0;
  ostream *local_3d8;
  ostream *local_3d0;
  ostream *local_3c8;
  ostream *local_3c0;
  ostream *local_3b8;
  ostream *local_3b0;
  ostream *local_3a8;
  ostream *local_3a0;
  ostream *local_398;
  ostream *local_390;
  int *local_388;
  int *local_380;
  QPTSolver *local_378;
  Game *local_370;
  int local_368;
  _label_vertex local_360;
  Game *local_350;
  int local_348;
  _label_vertex local_340;
  Game *local_330;
  int local_328;
  _label_vertex local_320;
  Game *local_310;
  int local_308;
  _label_vertex local_300;
  Game *local_2f0;
  int local_2e8;
  _label_vertex local_2e0;
  Game *local_2d0;
  int local_2c8;
  _label_vertex local_2c0;
  Game *local_2b0;
  int local_2a8;
  _label_vertex local_2a0;
  Game *local_290;
  int local_288;
  _label_vertex local_280;
  Game *local_270;
  int local_268;
  _label_vertex local_260;
  Game *local_250;
  int local_248;
  _label_vertex local_240;
  Game *local_230;
  int local_228;
  _label_vertex local_220;
  Game *local_210;
  int local_208;
  _label_vertex local_200;
  int local_1f0;
  int local_1ec;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int local_1d8;
  _label_vertex local_1d0;
  int local_1bc;
  int *piStack_1b8;
  int to;
  int *curedge;
  Game *pGStack_1a8;
  int i_1;
  int local_1a0;
  _label_vertex local_198;
  int local_184;
  byte local_17d;
  int s_cur;
  bool first;
  Game *pGStack_178;
  int local_170;
  _label_vertex local_168;
  Game *local_158;
  int local_150;
  _label_vertex local_148;
  Game *local_138;
  int local_130;
  _label_vertex local_128;
  Game *local_118;
  int local_110;
  _label_vertex local_108;
  Game *local_f8;
  int local_f0;
  _label_vertex local_e8;
  Game *local_d8;
  int local_d0;
  _label_vertex local_c8;
  Game *local_b8;
  int local_b0;
  _label_vertex local_a8;
  int local_94;
  Game *pGStack_90;
  int i;
  int local_88;
  _label_vertex local_80;
  Game *local_70;
  int local_68;
  _label_vertex local_60;
  int local_4c;
  ulong uStack_48;
  int old_strategy;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_2c;
  uint *puStack_28;
  int pr;
  int *pm;
  int target_local;
  int v_local;
  QPTSolver *this_local;
  
  puStack_28 = (uint *)(this->pm_nodes + this->k * v);
  if ((*puStack_28 != 0xffffffff) && ((*puStack_28 & 1) == this->pl)) {
    return false;
  }
  aiStack_460[4] = 0x21efff;
  aiStack_460[5] = 0;
  local_378 = this;
  pm._0_4_ = target;
  pm._4_4_ = v;
  _target_local = this;
  local_2c = Solver::priority(&this->super_Solver,v);
  __vla_expr0 = (unsigned_long)&local_448;
  local_388 = (int *)((long)&local_448 - ((ulong)(uint)local_378->k * 4 + 0xf & 0xfffffffffffffff0))
  ;
  __vla_expr1 = (ulong)(uint)local_378->k;
  piVar13 = (int *)((long)local_388 - ((ulong)(uint)local_378->k * 4 + 0xf & 0xfffffffffffffff0));
  local_380 = piVar13;
  uStack_48 = (ulong)(uint)local_378->k;
  local_4c = local_378->strategy[pm._4_4_];
  if (1 < (local_378->super_Solver).trace) {
    poVar10 = (local_378->super_Solver).logger;
    piVar13[-2] = 0x21f087;
    piVar13[-1] = 0;
    local_398 = std::operator<<(poVar10,"\x1b[37;1mupdating vertex ");
    iVar8 = pm._4_4_;
    pQVar5 = local_378;
    piVar13[-2] = 0x21f09d;
    piVar13[-1] = 0;
    _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
    poVar10 = local_398;
    local_70 = _Var15.g;
    local_68 = _Var15.v;
    local_60.g = local_70;
    local_60.v = local_68;
    piVar13[-2] = 0x21f0c2;
    piVar13[-1] = 0;
    local_390 = operator<<(poVar10,&local_60);
    iVar8 = pm._4_4_;
    pQVar5 = local_378;
    piVar13[-2] = 0x21f0d8;
    piVar13[-1] = 0;
    iVar8 = Solver::owner(&pQVar5->super_Solver,iVar8);
    poVar10 = local_390;
    pcVar14 = " (even)";
    if (iVar8 != 0) {
      pcVar14 = " (odd)";
    }
    piVar13[-2] = 0x21f0fb;
    piVar13[-1] = 0;
    poVar10 = std::operator<<(poVar10,pcVar14);
    piVar13[-2] = 0x21f10a;
    piVar13[-1] = 0;
    std::operator<<(poVar10,"\x1b[m with current measure");
    puVar6 = puStack_28;
    poVar10 = (local_378->super_Solver).logger;
    iVar8 = local_378->k;
    piVar13[-2] = 0x21f121;
    piVar13[-1] = 0;
    pm_stream(poVar10,(int *)puVar6,iVar8);
    poVar10 = (local_378->super_Solver).logger;
    piVar13[-2] = 0x21f138;
    piVar13[-1] = 0;
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  iVar8 = pm._4_4_;
  pQVar5 = local_378;
  if ((int)pm != -1) {
    piVar13[-2] = 0x21f151;
    piVar13[-1] = 0;
    iVar9 = Solver::owner(&pQVar5->super_Solver,iVar8);
    iVar8 = local_2c;
    piVar4 = local_388;
    if (iVar9 == local_378->pl) {
      piVar3 = local_378->pm_nodes;
      iVar12 = local_378->k * (int)pm;
      iVar9 = local_378->k;
      iVar1 = local_378->max;
      iVar2 = local_378->maxo;
      piVar13[-4] = local_378->pl;
      piVar13[-6] = 0x21f1a1;
      piVar13[-5] = 0;
      au(piVar4,piVar3 + iVar12,iVar8,iVar9,iVar1,iVar2,piVar13[-4]);
      piVar4 = local_388;
      iVar8 = local_378->k;
      iVar9 = local_378->pl;
      piVar13[-2] = 0x21f1be;
      piVar13[-1] = 0;
      uVar11 = pm_val(piVar4,iVar8,iVar9);
      if (local_378->goal < uVar11) {
        *local_388 = local_378->max;
      }
      if (1 < (local_378->super_Solver).trace) {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21f206;
        piVar13[-1] = 0;
        local_3a0 = std::operator<<(poVar10,"to successor ");
        iVar8 = (int)pm;
        pQVar5 = local_378;
        piVar13[-2] = 0x21f21c;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_3a0;
        pGStack_90 = _Var15.g;
        local_88 = _Var15.v;
        local_80.g = pGStack_90;
        local_80.v = local_88;
        piVar13[-2] = 0x21f247;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_80);
        piVar13[-2] = 0x21f256;
        piVar13[-1] = 0;
        std::operator<<(poVar10,":");
        poVar10 = (local_378->super_Solver).logger;
        piVar4 = local_378->pm_nodes;
        iVar9 = local_378->k * (int)pm;
        iVar8 = local_378->k;
        piVar13[-2] = 0x21f27e;
        piVar13[-1] = 0;
        pm_stream(poVar10,piVar4 + iVar9,iVar8);
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21f295;
        piVar13[-1] = 0;
        std::operator<<(poVar10," => ");
        piVar4 = local_388;
        poVar10 = (local_378->super_Solver).logger;
        iVar8 = local_378->k;
        piVar13[-2] = 0x21f2af;
        piVar13[-1] = 0;
        pm_stream(poVar10,piVar4,iVar8);
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21f2c6;
        piVar13[-1] = 0;
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      puVar6 = puStack_28;
      piVar4 = local_388;
      iVar8 = local_378->k;
      iVar9 = local_378->pl;
      piVar13[-2] = 0x21f2e3;
      piVar13[-1] = 0;
      bVar7 = pm_less((int *)puVar6,piVar4,iVar8,iVar9);
      if (!bVar7) {
        return false;
      }
      for (local_94 = 0; local_94 < local_378->k; local_94 = local_94 + 1) {
        puStack_28[local_94] = local_388[local_94];
      }
      if (((local_378->super_Solver).trace != 0) && ((int)pm != local_378->strategy[pm._4_4_])) {
        if (local_378->strategy[pm._4_4_] == -1) {
          poVar10 = (local_378->super_Solver).logger;
          piVar13[-2] = 0x21f394;
          piVar13[-1] = 0;
          std::operator<<(poVar10,"\x1b[1;38;5;208m");
          poVar10 = (local_378->super_Solver).logger;
          piVar13[-2] = 0x21f3ab;
          piVar13[-1] = 0;
          local_3b0 = std::operator<<(poVar10,"set strategy\x1b[m of \x1b[36;1m");
          iVar8 = pm._4_4_;
          pQVar5 = local_378;
          piVar13[-2] = 0x21f3c1;
          piVar13[-1] = 0;
          _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
          poVar10 = local_3b0;
          local_b8 = _Var15.g;
          local_b0 = _Var15.v;
          local_a8.g = local_b8;
          local_a8.v = local_b0;
          piVar13[-2] = 0x21f3fb;
          piVar13[-1] = 0;
          poVar10 = operator<<(poVar10,&local_a8);
          piVar13[-2] = 0x21f40a;
          piVar13[-1] = 0;
          local_3a8 = std::operator<<(poVar10,"\x1b[m to \x1b[36;1m");
          iVar8 = (int)pm;
          pQVar5 = local_378;
          piVar13[-2] = 0x21f420;
          piVar13[-1] = 0;
          _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
          poVar10 = local_3a8;
          local_d8 = _Var15.g;
          local_d0 = _Var15.v;
          local_c8.g = local_d8;
          local_c8.v = local_d0;
          piVar13[-2] = 0x21f45a;
          piVar13[-1] = 0;
          poVar10 = operator<<(poVar10,&local_c8);
          piVar13[-2] = 0x21f469;
          piVar13[-1] = 0;
          std::operator<<(poVar10,"\x1b[m\n");
        }
        else {
          poVar10 = (local_378->super_Solver).logger;
          piVar13[-2] = 0x21f485;
          piVar13[-1] = 0;
          std::operator<<(poVar10,"\x1b[1;38;5;208m");
          poVar10 = (local_378->super_Solver).logger;
          piVar13[-2] = 0x21f49c;
          piVar13[-1] = 0;
          local_3c8 = std::operator<<(poVar10,"changed strategy\x1b[m of \x1b[36;1m");
          iVar8 = pm._4_4_;
          pQVar5 = local_378;
          piVar13[-2] = 0x21f4b2;
          piVar13[-1] = 0;
          _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
          poVar10 = local_3c8;
          local_f8 = _Var15.g;
          local_f0 = _Var15.v;
          local_e8.g = local_f8;
          local_e8.v = local_f0;
          piVar13[-2] = 0x21f4ec;
          piVar13[-1] = 0;
          poVar10 = operator<<(poVar10,&local_e8);
          piVar13[-2] = 0x21f4fb;
          piVar13[-1] = 0;
          local_3c0 = std::operator<<(poVar10,"\x1b[m from \x1b[36;1m");
          pQVar5 = local_378;
          iVar8 = local_378->strategy[pm._4_4_];
          piVar13[-2] = 0x21f519;
          piVar13[-1] = 0;
          _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
          poVar10 = local_3c0;
          local_118 = _Var15.g;
          local_110 = _Var15.v;
          local_108.g = local_118;
          local_108.v = local_110;
          piVar13[-2] = 0x21f553;
          piVar13[-1] = 0;
          poVar10 = operator<<(poVar10,&local_108);
          piVar13[-2] = 0x21f562;
          piVar13[-1] = 0;
          local_3b8 = std::operator<<(poVar10,"\x1b[m to \x1b[36;1m");
          iVar8 = (int)pm;
          pQVar5 = local_378;
          piVar13[-2] = 0x21f578;
          piVar13[-1] = 0;
          _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
          poVar10 = local_3b8;
          local_138 = _Var15.g;
          local_130 = _Var15.v;
          local_128.g = local_138;
          local_128.v = local_130;
          piVar13[-2] = 0x21f5b2;
          piVar13[-1] = 0;
          poVar10 = operator<<(poVar10,&local_128);
          piVar13[-2] = 0x21f5c1;
          piVar13[-1] = 0;
          std::operator<<(poVar10,"\x1b[m\n");
        }
      }
      local_378->strategy[pm._4_4_] = (int)pm;
      if ((local_378->super_Solver).trace != 0) {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21f5f9;
        piVar13[-1] = 0;
        local_3d8 = std::operator<<(poVar10,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m");
        iVar8 = pm._4_4_;
        pQVar5 = local_378;
        piVar13[-2] = 0x21f60f;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_3d8;
        local_158 = _Var15.g;
        local_150 = _Var15.v;
        local_148.g = local_158;
        local_148.v = local_150;
        piVar13[-2] = 0x21f649;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_148);
        piVar13[-2] = 0x21f658;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[m:");
        puVar6 = puStack_28;
        poVar10 = (local_378->super_Solver).logger;
        iVar8 = local_378->k;
        piVar13[-2] = 0x21f66f;
        piVar13[-1] = 0;
        pm_stream(poVar10,(int *)puVar6,iVar8);
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21f686;
        piVar13[-1] = 0;
        local_3d0 = std::operator<<(poVar10," (to ");
        iVar8 = (int)pm;
        pQVar5 = local_378;
        piVar13[-2] = 0x21f69c;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_3d0;
        pGStack_178 = _Var15.g;
        local_170 = _Var15.v;
        local_168.g = pGStack_178;
        local_168.v = local_170;
        piVar13[-2] = 0x21f6d6;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_168);
        piVar13[-2] = 0x21f6e5;
        piVar13[-1] = 0;
        std::operator<<(poVar10,")\n");
      }
      return true;
    }
    if ((local_378->strategy[pm._4_4_] != -1) && ((int)pm != local_378->strategy[pm._4_4_])) {
      return false;
    }
  }
  iVar9 = local_2c;
  piVar4 = local_388;
  local_17d = 1;
  iVar8 = local_378->strategy[pm._4_4_];
  local_184 = iVar8;
  if (iVar8 != -1) {
    piVar3 = local_378->pm_nodes;
    iVar1 = local_378->k;
    iVar2 = local_378->k;
    iVar12 = local_378->max;
    maxopp = local_378->maxo;
    piVar13[-4] = local_378->pl;
    piVar13[-6] = 0x21f7bd;
    piVar13[-5] = 0;
    au(piVar4,piVar3 + iVar1 * iVar8,iVar9,iVar2,iVar12,maxopp,piVar13[-4]);
    piVar4 = local_388;
    iVar8 = local_378->k;
    iVar9 = local_378->pl;
    piVar13[-2] = 0x21f7da;
    piVar13[-1] = 0;
    uVar11 = pm_val(piVar4,iVar8,iVar9);
    if (local_378->goal < uVar11) {
      *local_388 = local_378->max;
    }
    if (1 < (local_378->super_Solver).trace) {
      poVar10 = (local_378->super_Solver).logger;
      piVar13[-2] = 0x21f822;
      piVar13[-1] = 0;
      local_3e0 = std::operator<<(poVar10,"to successor ");
      iVar8 = local_184;
      pQVar5 = local_378;
      piVar13[-2] = 0x21f83b;
      piVar13[-1] = 0;
      _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
      poVar10 = local_3e0;
      pGStack_1a8 = _Var15.g;
      local_1a0 = _Var15.v;
      local_198.g = pGStack_1a8;
      local_198.v = local_1a0;
      piVar13[-2] = 0x21f875;
      piVar13[-1] = 0;
      poVar10 = operator<<(poVar10,&local_198);
      piVar13[-2] = 0x21f884;
      piVar13[-1] = 0;
      std::operator<<(poVar10,":");
      poVar10 = (local_378->super_Solver).logger;
      piVar4 = local_378->pm_nodes;
      iVar9 = local_378->k * local_184;
      iVar8 = local_378->k;
      piVar13[-2] = 0x21f8af;
      piVar13[-1] = 0;
      pm_stream(poVar10,piVar4 + iVar9,iVar8);
      poVar10 = (local_378->super_Solver).logger;
      piVar13[-2] = 0x21f8c6;
      piVar13[-1] = 0;
      std::operator<<(poVar10," => ");
      piVar4 = local_388;
      poVar10 = (local_378->super_Solver).logger;
      iVar8 = local_378->k;
      piVar13[-2] = 0x21f8e0;
      piVar13[-1] = 0;
      pm_stream(poVar10,piVar4,iVar8);
      poVar10 = (local_378->super_Solver).logger;
      piVar13[-2] = 0x21f8f7;
      piVar13[-1] = 0;
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    for (curedge._4_4_ = 0; curedge._4_4_ < local_378->k; curedge._4_4_ = curedge._4_4_ + 1) {
      local_380[curedge._4_4_] = local_388[curedge._4_4_];
    }
    local_17d = 0;
  }
  iVar8 = pm._4_4_;
  pQVar5 = local_378;
  piVar13[-2] = 0x21f95c;
  piVar13[-1] = 0;
  for (piStack_1b8 = Solver::outs(&pQVar5->super_Solver,iVar8); puVar6 = puStack_28,
      piVar4 = local_380, *piStack_1b8 != -1; piStack_1b8 = piStack_1b8 + 1) {
    local_1bc = *piStack_1b8;
    this_00 = (local_378->super_Solver).disabled;
    pos = (size_t)local_1bc;
    piVar13[-2] = 0x21f999;
    piVar13[-1] = 0;
    bVar7 = bitset::operator[](this_00,pos);
    iVar8 = local_2c;
    piVar4 = local_388;
    if ((!bVar7) && (local_1bc != local_184)) {
      piVar3 = local_378->pm_nodes;
      iVar12 = local_378->k * local_1bc;
      iVar9 = local_378->k;
      iVar1 = local_378->max;
      iVar2 = local_378->maxo;
      piVar13[-4] = local_378->pl;
      piVar13[-6] = 0x21f9fa;
      piVar13[-5] = 0;
      au(piVar4,piVar3 + iVar12,iVar8,iVar9,iVar1,iVar2,piVar13[-4]);
      piVar4 = local_388;
      iVar8 = local_378->k;
      iVar9 = local_378->pl;
      piVar13[-2] = 0x21fa17;
      piVar13[-1] = 0;
      uVar11 = pm_val(piVar4,iVar8,iVar9);
      if (local_378->goal < uVar11) {
        *local_388 = local_378->max;
      }
      if (1 < (local_378->super_Solver).trace) {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21fa5f;
        piVar13[-1] = 0;
        local_3e8 = std::operator<<(poVar10,"to successor ");
        iVar8 = local_1bc;
        pQVar5 = local_378;
        piVar13[-2] = 0x21fa78;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_3e8;
        _i_3 = _Var15.g;
        local_1d8 = _Var15.v;
        local_1d0.g = _i_3;
        local_1d0.v = local_1d8;
        piVar13[-2] = 0x21fab2;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_1d0);
        piVar13[-2] = 0x21fac1;
        piVar13[-1] = 0;
        std::operator<<(poVar10,":");
        poVar10 = (local_378->super_Solver).logger;
        piVar4 = local_378->pm_nodes;
        iVar9 = local_378->k * local_1bc;
        iVar8 = local_378->k;
        piVar13[-2] = 0x21faec;
        piVar13[-1] = 0;
        pm_stream(poVar10,piVar4 + iVar9,iVar8);
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21fb03;
        piVar13[-1] = 0;
        std::operator<<(poVar10," => ");
        piVar4 = local_388;
        poVar10 = (local_378->super_Solver).logger;
        iVar8 = local_378->k;
        piVar13[-2] = 0x21fb1d;
        piVar13[-1] = 0;
        pm_stream(poVar10,piVar4,iVar8);
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21fb34;
        piVar13[-1] = 0;
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      iVar8 = pm._4_4_;
      pQVar5 = local_378;
      if ((local_17d & 1) == 0) {
        piVar13[-2] = 0x21fbbf;
        piVar13[-1] = 0;
        iVar8 = Solver::owner(&pQVar5->super_Solver,iVar8);
        piVar3 = local_380;
        piVar4 = local_388;
        if (iVar8 == local_378->pl) {
          iVar8 = local_378->k;
          iVar9 = local_378->pl;
          piVar13[-2] = 0x21fbef;
          piVar13[-1] = 0;
          bVar7 = pm_less(piVar3,piVar4,iVar8,iVar9);
          if (bVar7) {
            for (i_5 = 0; i_5 < local_378->k; i_5 = i_5 + 1) {
              local_380[i_5] = local_388[i_5];
            }
            local_378->strategy[pm._4_4_] = local_1bc;
          }
        }
        else {
          iVar8 = local_378->k;
          iVar9 = local_378->pl;
          piVar13[-2] = 0x21fc81;
          piVar13[-1] = 0;
          bVar7 = pm_less(piVar4,piVar3,iVar8,iVar9);
          if (bVar7) {
            for (local_1ec = 0; local_1ec < local_378->k; local_1ec = local_1ec + 1) {
              local_380[local_1ec] = local_388[local_1ec];
            }
            local_378->strategy[pm._4_4_] = local_1bc;
          }
        }
      }
      else {
        local_17d = 0;
        for (i_4 = 0; i_4 < local_378->k; i_4 = i_4 + 1) {
          local_380[i_4] = local_388[i_4];
        }
        local_378->strategy[pm._4_4_] = local_1bc;
      }
    }
  }
  iVar8 = local_378->k;
  iVar9 = local_378->pl;
  piVar13[-2] = 0x21fd28;
  piVar13[-1] = 0;
  bVar7 = pm_less((int *)puVar6,piVar4,iVar8,iVar9);
  iVar8 = pm._4_4_;
  pQVar5 = local_378;
  if (bVar7) {
    for (local_1f0 = 0; local_1f0 < local_378->k; local_1f0 = local_1f0 + 1) {
      puStack_28[local_1f0] = local_380[local_1f0];
    }
    if (((local_378->super_Solver).trace != 0) && (local_4c != local_378->strategy[pm._4_4_])) {
      piVar13[-2] = 0x21fdb8;
      piVar13[-1] = 0;
      iVar8 = Solver::owner(&pQVar5->super_Solver,iVar8);
      if (iVar8 == local_378->pl) {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21fddb;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[1;38;5;208m");
      }
      else {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21fdf4;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[1;31m");
      }
      if (local_4c == -1) {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21fe15;
        piVar13[-1] = 0;
        local_3f8 = std::operator<<(poVar10,"set strategy\x1b[m of \x1b[36;1m");
        iVar8 = pm._4_4_;
        pQVar5 = local_378;
        piVar13[-2] = 0x21fe2b;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_3f8;
        local_210 = _Var15.g;
        local_208 = _Var15.v;
        local_200.g = local_210;
        local_200.v = local_208;
        piVar13[-2] = 0x21fe65;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_200);
        piVar13[-2] = 0x21fe74;
        piVar13[-1] = 0;
        local_3f0 = std::operator<<(poVar10,"\x1b[m to \x1b[36;1m");
        pQVar5 = local_378;
        iVar8 = local_378->strategy[pm._4_4_];
        piVar13[-2] = 0x21fe92;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_3f0;
        local_230 = _Var15.g;
        local_228 = _Var15.v;
        local_220.g = local_230;
        local_220.v = local_228;
        piVar13[-2] = 0x21fecc;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_220);
        piVar13[-2] = 0x21fedb;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[m\n");
      }
      else {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x21fef7;
        piVar13[-1] = 0;
        local_410 = std::operator<<(poVar10,"changed strategy\x1b[m of \x1b[36;1m");
        iVar8 = pm._4_4_;
        pQVar5 = local_378;
        piVar13[-2] = 0x21ff0d;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_410;
        local_250 = _Var15.g;
        local_248 = _Var15.v;
        local_240.g = local_250;
        local_240.v = local_248;
        piVar13[-2] = 0x21ff47;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_240);
        piVar13[-2] = 0x21ff56;
        piVar13[-1] = 0;
        local_408 = std::operator<<(poVar10,"\x1b[m from \x1b[36;1m");
        iVar8 = local_4c;
        pQVar5 = local_378;
        piVar13[-2] = 0x21ff6c;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_408;
        local_270 = _Var15.g;
        local_268 = _Var15.v;
        local_260.g = local_270;
        local_260.v = local_268;
        piVar13[-2] = 0x21ffa6;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_260);
        piVar13[-2] = 0x21ffb5;
        piVar13[-1] = 0;
        local_400 = std::operator<<(poVar10,"\x1b[m to \x1b[36;1m");
        pQVar5 = local_378;
        iVar8 = local_378->strategy[pm._4_4_];
        piVar13[-2] = 0x21ffd3;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_400;
        local_290 = _Var15.g;
        local_288 = _Var15.v;
        local_280.g = local_290;
        local_280.v = local_288;
        piVar13[-2] = 0x22000d;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_280);
        piVar13[-2] = 0x22001c;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[m\n");
      }
    }
    if ((local_378->super_Solver).trace != 0) {
      poVar10 = (local_378->super_Solver).logger;
      piVar13[-2] = 0x220046;
      piVar13[-1] = 0;
      local_420 = std::operator<<(poVar10,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m");
      iVar8 = pm._4_4_;
      pQVar5 = local_378;
      piVar13[-2] = 0x22005c;
      piVar13[-1] = 0;
      _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
      poVar10 = local_420;
      local_2b0 = _Var15.g;
      local_2a8 = _Var15.v;
      local_2a0.g = local_2b0;
      local_2a0.v = local_2a8;
      piVar13[-2] = 0x220096;
      piVar13[-1] = 0;
      poVar10 = operator<<(poVar10,&local_2a0);
      piVar13[-2] = 0x2200a5;
      piVar13[-1] = 0;
      std::operator<<(poVar10,"\x1b[m:");
      puVar6 = puStack_28;
      poVar10 = (local_378->super_Solver).logger;
      iVar8 = local_378->k;
      piVar13[-2] = 0x2200bc;
      piVar13[-1] = 0;
      pm_stream(poVar10,(int *)puVar6,iVar8);
      poVar10 = (local_378->super_Solver).logger;
      piVar13[-2] = 0x2200d3;
      piVar13[-1] = 0;
      local_418 = std::operator<<(poVar10," (to ");
      pQVar5 = local_378;
      iVar8 = local_378->strategy[pm._4_4_];
      piVar13[-2] = 0x2200f1;
      piVar13[-1] = 0;
      _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
      poVar10 = local_418;
      local_2d0 = _Var15.g;
      local_2c8 = _Var15.v;
      local_2c0.g = local_2d0;
      local_2c0.v = local_2c8;
      piVar13[-2] = 0x22012b;
      piVar13[-1] = 0;
      poVar10 = operator<<(poVar10,&local_2c0);
      piVar13[-2] = 0x22013a;
      piVar13[-1] = 0;
      std::operator<<(poVar10,")\n");
    }
    this_local._7_1_ = true;
  }
  else {
    if (((local_378->super_Solver).trace != 0) && (local_4c != local_378->strategy[pm._4_4_])) {
      piVar13[-2] = 0x220188;
      piVar13[-1] = 0;
      iVar8 = Solver::owner(&pQVar5->super_Solver,iVar8);
      if (iVar8 == local_378->pl) {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x2201ab;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[1;38;5;208m");
      }
      else {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x2201c4;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[1;31m");
      }
      if (local_4c == -1) {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x2201e5;
        piVar13[-1] = 0;
        local_430 = std::operator<<(poVar10,"set strategy\x1b[m of \x1b[36;1m");
        iVar8 = pm._4_4_;
        pQVar5 = local_378;
        piVar13[-2] = 0x2201fb;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_430;
        local_2f0 = _Var15.g;
        local_2e8 = _Var15.v;
        local_2e0.g = local_2f0;
        local_2e0.v = local_2e8;
        piVar13[-2] = 0x220235;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_2e0);
        piVar13[-2] = 0x220244;
        piVar13[-1] = 0;
        local_428 = std::operator<<(poVar10,"\x1b[m to \x1b[36;1m");
        pQVar5 = local_378;
        iVar8 = local_378->strategy[pm._4_4_];
        piVar13[-2] = 0x220262;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_428;
        local_310 = _Var15.g;
        local_308 = _Var15.v;
        local_300.g = local_310;
        local_300.v = local_308;
        piVar13[-2] = 0x22029c;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_300);
        piVar13[-2] = 0x2202ab;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[m\n");
      }
      else {
        poVar10 = (local_378->super_Solver).logger;
        piVar13[-2] = 0x2202c7;
        piVar13[-1] = 0;
        local_448 = std::operator<<(poVar10,"changed strategy\x1b[m of \x1b[36;1m");
        iVar8 = pm._4_4_;
        pQVar5 = local_378;
        piVar13[-2] = 0x2202dd;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_448;
        local_330 = _Var15.g;
        local_328 = _Var15.v;
        local_320.g = local_330;
        local_320.v = local_328;
        piVar13[-2] = 0x220317;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_320);
        piVar13[-2] = 0x220326;
        piVar13[-1] = 0;
        local_440 = std::operator<<(poVar10,"\x1b[m from \x1b[36;1m");
        iVar8 = local_4c;
        pQVar5 = local_378;
        piVar13[-2] = 0x22033c;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_440;
        local_350 = _Var15.g;
        local_348 = _Var15.v;
        local_340.g = local_350;
        local_340.v = local_348;
        piVar13[-2] = 0x220376;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_340);
        piVar13[-2] = 0x220385;
        piVar13[-1] = 0;
        local_438 = std::operator<<(poVar10,"\x1b[m to \x1b[36;1m");
        pQVar5 = local_378;
        iVar8 = local_378->strategy[pm._4_4_];
        piVar13[-2] = 0x2203a3;
        piVar13[-1] = 0;
        _Var15 = Solver::label_vertex(&pQVar5->super_Solver,iVar8);
        poVar10 = local_438;
        local_370 = _Var15.g;
        local_368 = _Var15.v;
        local_360.g = local_370;
        local_360.v = local_368;
        piVar13[-2] = 0x2203dd;
        piVar13[-1] = 0;
        poVar10 = operator<<(poVar10,&local_360);
        piVar13[-2] = 0x2203ec;
        piVar13[-1] = 0;
        std::operator<<(poVar10,"\x1b[m\n");
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
QPTSolver::lift(int v, int target)
{
    // check if already Top
    int * const pm = pm_nodes + k*v; // obtain ptr to current progress measure
    if (pm[0] != -1 and (pm[0]&1) == pl) return false;

    const int pr = priority(v);
    int tmp[k], res[k];

#ifndef NDEBUG
    int old_strategy = strategy[v];

    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        pm_stream(logger, pm, k);
        logger << std::endl;
    }
#endif

    // First special cases if we are lifting triggered by a given <target>.

    if (1 and target != -1) {
        if (owner(v) == pl) {
            // if owned by <pl>, just check if target is better.
            au(tmp, pm_nodes + k*target, pr, k, max, maxo, pl);
            if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // lol
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                pm_stream(logger, pm_nodes + k*target, k);
                logger << " => ";
                pm_stream(logger, tmp, k);
                logger << std::endl;
            }
#endif
            if (pm_less(pm, tmp, k, pl)) {
                // target is better, update, report, return
                for (int i=0; i<k; i++) pm[i] = tmp[i];
#ifndef NDEBUG
                if (trace and target != strategy[v]) {
                    if (strategy[v] == -1) {
                        logger << "\033[1;38;5;208m";
                        logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    } else {
                        logger << "\033[1;38;5;208m";
                        logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(strategy[v]) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    }
                }
                strategy[v] = target; // does not matter for algorithm, only for output here
#endif
#ifndef NDEBUG
                if (trace) {
                    logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                    pm_stream(logger, pm, k);
                    logger << " (to " << label_vertex(target) << ")\n";
                }
#endif
                return true;
            } else {
                // target not better, not checking other directions
                return false;
            }
        } else {
            // if owned by ~<pl>, test if strategy is target
            if (strategy[v] != -1 and target != strategy[v]) {
                return false; // no need to do anything... strategy is still same
            }
        }
    }

    // Compute best measure by going over all successors

    bool first = true;
    int s_cur = strategy[v];
    if (s_cur != -1) {
        // first set to current...
        au(tmp, pm_nodes + k*s_cur, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(s_cur) << ":";
            pm_stream(logger, pm_nodes + k*s_cur, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        for (int i=0; i<k; i++) res[i] = tmp[i];
        first = false;
    }
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        if (to == s_cur) continue;
        au(tmp, pm_nodes + k*to, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << ":";
            pm_stream(logger, pm_nodes + k*to, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        if (first) {
            first = false;
            for (int i=0; i<k; i++) res[i] = tmp[i];
            strategy[v] = to;
        } else if (owner(v) == pl) {
            // we want the max
            if (pm_less(res, tmp, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        } else {
            // we want the min
            if (pm_less(tmp, res, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        }
    }

    // now "res" contains the best au
    if (pm_less(pm, res, k, pl)) {
        // ok, it's an update
        for (int i=0; i<k; i++) pm[i] = res[i];
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
        if (trace) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            pm_stream(logger, pm, k);
            logger << " (to " << label_vertex(strategy[v]) << ")\n";
        }
#endif
        return true;
    } else {
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
#endif
        return false;
    }
}